

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

size_t duckdb_snappy::Compress
                 (char *input,size_t input_length,string *compressed,CompressionOptions options)

{
  undefined4 in_ECX;
  ulong in_RDX;
  size_t in_RSI;
  string *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  CompressionOptions in_stack_00000014;
  size_t compressed_length;
  ulong new_size;
  string *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff8;
  
  new_size = in_RDX;
  MaxCompressedLength(in_RSI);
  STLStringResizeUninitialized(in_stack_ffffffffffffffc0,new_size);
  string_as_array(in_RDI);
  RawCompress(in_stack_00000008,unaff_retaddr,(char *)CONCAT44(in_ECX,in_stack_fffffffffffffff8),
              (size_t *)in_RDI,in_stack_00000014);
  std::__cxx11::string::erase(in_RDX,local_28);
  return local_28;
}

Assistant:

size_t Compress(const char* input, size_t input_length, std::string* compressed,
                CompressionOptions options) {
  // Pre-grow the buffer to the max length of the compressed output
  STLStringResizeUninitialized(compressed, MaxCompressedLength(input_length));

  size_t compressed_length;
  RawCompress(input, input_length, string_as_array(compressed),
              &compressed_length, options);
  compressed->erase(compressed_length);
  return compressed_length;
}